

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPCnInp.cpp
# Opt level: O0

void __thiscall NaPetriCnInput::commit_data(NaPetriCnInput *this)

{
  int iVar1;
  NaPetriCnOutput *pNVar2;
  long *in_RDI;
  NaPetriConnector *unaff_retaddr;
  NaPetriCnInput *in_stack_ffffffffffffffe8;
  
  iVar1 = (**(code **)(*in_RDI + 0x10))();
  if (0 < iVar1) {
    pNVar2 = adjoint(in_stack_ffffffffffffffe8);
    *(int *)(in_RDI + 8) = pNVar2->idData;
    pNVar2 = adjoint(in_stack_ffffffffffffffe8);
    pNVar2->nPrCnt = pNVar2->nPrCnt + 1;
    NaPetriConnector::commit_data(unaff_retaddr);
  }
  return;
}

Assistant:

void
NaPetriCnInput::commit_data ()
{
    if(links() > 0){
        idData = adjoint()->idData;     // Mark own data as old
        ++adjoint()->nPrCnt;            // One more processed connector

	NaPetriConnector::commit_data();
    }
}